

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall
spvtools::val::Instruction::RegisterUse(Instruction *this,Instruction *inst,uint32_t index)

{
  pointer *pppVar1;
  iterator __position;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> local_10;
  
  __position._M_current =
       (this->uses_).
       super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->uses_).
      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10.first = inst;
    local_10.second = index;
    std::
    vector<std::pair<spvtools::val::Instruction_const*,unsigned_int>,std::allocator<std::pair<spvtools::val::Instruction_const*,unsigned_int>>>
    ::_M_realloc_insert<std::pair<spvtools::val::Instruction_const*,unsigned_int>>
              ((vector<std::pair<spvtools::val::Instruction_const*,unsigned_int>,std::allocator<std::pair<spvtools::val::Instruction_const*,unsigned_int>>>
                *)&this->uses_,__position,&local_10);
  }
  else {
    (__position._M_current)->first = inst;
    *(ulong *)&(__position._M_current)->second = CONCAT44(local_10._12_4_,index);
    pppVar1 = &(this->uses_).
               super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  return;
}

Assistant:

void Instruction::RegisterUse(const Instruction* inst, uint32_t index) {
  uses_.push_back(std::make_pair(inst, index));
}